

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

bool __thiscall cmCTestSVN::UpdateImpl(cmCTestSVN *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *command;
  pointer pbVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> svn_update;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  OutputLogger err;
  string opts;
  UpdateParser out;
  string local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  LineParser local_198;
  string local_158;
  UpdateParser local_138;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string((string *)&local_138,"UpdateOptions",(allocator *)&local_198);
  cmCTest::GetCTestConfiguration(&local_158,pcVar1,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  command = extraout_RDX;
  if (local_158._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::string::string((string *)&local_198,"SVNUpdateOptions",(allocator *)&local_1d8);
    cmCTest::GetCTestConfiguration((string *)&local_138,pcVar1,(string *)&local_198);
    std::__cxx11::string::operator=((string *)&local_158,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_198);
    command = extraout_RDX_00;
  }
  cmSystemTools::ParseArguments_abi_cxx11_
            (&local_1b0,(cmSystemTools *)local_158._M_dataplus._M_p,command);
  if (((this->super_cmCTestGlobalVC).super_cmCTestVC.CTest)->TestModel == 1) {
    cmCTestVC::GetNightlyTime_abi_cxx11_(&local_1d8,(cmCTestVC *)this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198,
                   "-r{",&local_1d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198,
                   " +0000}");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  local_1d8.field_2._M_allocated_capacity = 0;
  local_1d8._M_dataplus._M_p = (pointer)0x0;
  local_1d8._M_string_length = 0;
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x51c0bf;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)&local_138);
  for (pbVar3 = local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    local_138.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)(pbVar3->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)&local_138);
  }
  UpdateParser::UpdateParser(&local_138,this,"up-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_198,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"up-err> "
            );
  bVar2 = RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8,
                        (OutputParser *)&local_138,&local_198.super_OutputParser);
  cmProcessTools::LineParser::~LineParser(&local_198);
  UpdateParser::~UpdateParser(&local_138);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  std::__cxx11::string::~string((string *)&local_158);
  return bVar2;
}

Assistant:

bool cmCTestSVN::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if(opts.empty())
    {
    opts = this->CTest->GetCTestConfiguration("SVNUpdateOptions");
    }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts.c_str());

  // Specify the start time for nightly testing.
  if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)
    {
    args.push_back("-r{" + this->GetNightlyTime() + " +0000}");
    }

  std::vector<char const*> svn_update;
  svn_update.push_back("update");
  for(std::vector<std::string>::const_iterator ai = args.begin();
      ai != args.end(); ++ai)
    {
    svn_update.push_back(ai->c_str());
    }

  UpdateParser out(this, "up-out> ");
  OutputLogger err(this->Log, "up-err> ");
  return this->RunSVNCommand(svn_update, &out, &err);
}